

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_body_declare
               (NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"An atomic_uint variable cannot be declared in local scope",
             &local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  iterateShaders(ctx,TESTCASE_BODY_DECLARE);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_body_declare (NegativeTestContext& ctx)
{
	ctx.beginSection("An atomic_uint variable cannot be declared in local scope");
	iterateShaders(ctx, TESTCASE_BODY_DECLARE);
	ctx.endSection();
}